

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int sftp_symlink(LIBSSH2_SFTP *sftp,char *path,uint path_len,char *target,uint target_len,
                int link_type)

{
  int iVar1;
  uint32_t uVar2;
  uchar *puVar3;
  int local_88;
  ssize_t rc;
  uchar *puStack_70;
  int retcode;
  uchar *data;
  uchar *s;
  ssize_t packet_len;
  size_t link_len;
  size_t data_len;
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel;
  int link_type_local;
  uint target_len_local;
  char *target_local;
  char *pcStack_20;
  uint path_len_local;
  char *path_local;
  LIBSSH2_SFTP *sftp_local;
  
  session = (LIBSSH2_SESSION *)sftp->channel;
  data_len = (size_t)session->kex_prefs;
  link_len = 0;
  if (link_type == 0) {
    local_88 = target_len + 4;
  }
  else {
    local_88 = 0;
  }
  s = (uchar *)(ulong)(path_len + 0xd + local_88);
  puStack_70 = (uchar *)0x0;
  channel._0_4_ = link_type;
  channel._4_4_ = target_len;
  _link_type_local = target;
  target_local._4_4_ = path_len;
  pcStack_20 = path;
  path_local = (char *)sftp;
  if (sftp->symlink_state == libssh2_NB_state_idle) {
    sftp->last_errno = 0;
    if ((sftp->version < 3) && (link_type != 2)) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,
                             "Server does not support SYMLINK or READLINK");
      return iVar1;
    }
    data = (uchar *)(*((LIBSSH2_SESSION *)data_len)->alloc)((size_t)s,(void **)data_len);
    *(uchar **)(path_local + 0x160) = data;
    if (*(long *)(path_local + 0x160) == 0) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_len,-6,
                             "Unable to allocate memory for SYMLINK/READLINK/REALPATH packet");
      return iVar1;
    }
    _libssh2_store_u32(&data,(int)s - 4);
    if ((int)channel == 0) {
      *data = '\x14';
    }
    else if (((int)channel == 1) || ((int)channel != 2)) {
      *data = '\x13';
    }
    else {
      *data = '\x10';
    }
    data = data + 1;
    iVar1 = *(int *)(path_local + 8);
    *(int *)(path_local + 8) = iVar1 + 1;
    *(int *)(path_local + 0x168) = iVar1;
    _libssh2_store_u32(&data,*(uint32_t *)(path_local + 0x168));
    _libssh2_store_str(&data,pcStack_20,(ulong)target_local._4_4_);
    if ((int)channel == 0) {
      _libssh2_store_str(&data,_link_type_local,(ulong)channel._4_4_);
    }
    path_local[0x15c] = '\x02';
    path_local[0x15d] = '\0';
    path_local[0x15e] = '\0';
    path_local[0x15f] = '\0';
  }
  if (*(int *)(path_local + 0x15c) == 2) {
    puVar3 = (uchar *)_libssh2_channel_write
                                ((LIBSSH2_CHANNEL *)session,0,*(uchar **)(path_local + 0x160),
                                 (size_t)s);
    if (puVar3 == (uchar *)0xffffffffffffffdb) {
      return -0x25;
    }
    if (s != puVar3) {
      (**(code **)(data_len + 0x18))(*(undefined8 *)(path_local + 0x160),data_len);
      path_local[0x160] = '\0';
      path_local[0x161] = '\0';
      path_local[0x162] = '\0';
      path_local[0x163] = '\0';
      path_local[0x164] = '\0';
      path_local[0x165] = '\0';
      path_local[0x166] = '\0';
      path_local[0x167] = '\0';
      path_local[0x15c] = '\0';
      path_local[0x15d] = '\0';
      path_local[0x15e] = '\0';
      path_local[0x15f] = '\0';
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_len,-7,
                             "Unable to send SYMLINK/READLINK command");
      return iVar1;
    }
    (**(code **)(data_len + 0x18))(*(undefined8 *)(path_local + 0x160),data_len);
    path_local[0x160] = '\0';
    path_local[0x161] = '\0';
    path_local[0x162] = '\0';
    path_local[0x163] = '\0';
    path_local[0x164] = '\0';
    path_local[0x165] = '\0';
    path_local[0x166] = '\0';
    path_local[0x167] = '\0';
    path_local[0x15c] = '\x03';
    path_local[0x15d] = '\0';
    path_local[0x15e] = '\0';
    path_local[0x15f] = '\0';
  }
  iVar1 = sftp_packet_requirev
                    ((LIBSSH2_SFTP *)path_local,2,"he",*(uint32_t *)(path_local + 0x168),
                     &stack0xffffffffffffff90,&link_len,9);
  if (iVar1 == -0x25) {
    sftp_local._4_4_ = -0x25;
  }
  else if (iVar1 == -0x26) {
    if (link_len != 0) {
      (**(code **)(data_len + 0x18))(puStack_70,data_len);
    }
    sftp_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"SFTP symlink packet too short");
  }
  else if (iVar1 == 0) {
    path_local[0x15c] = '\0';
    path_local[0x15d] = '\0';
    path_local[0x15e] = '\0';
    path_local[0x15f] = '\0';
    if (*puStack_70 == 'e') {
      uVar2 = _libssh2_ntohu32(puStack_70 + 5);
      (**(code **)(data_len + 0x18))(puStack_70,data_len);
      if (uVar2 == 0) {
        sftp_local._4_4_ = 0;
      }
      else {
        *(uint32_t *)(path_local + 0x48) = uVar2;
        sftp_local._4_4_ = _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"SFTP Protocol Error");
      }
    }
    else {
      uVar2 = _libssh2_ntohu32(puStack_70 + 5);
      if (uVar2 == 0) {
        (**(code **)(data_len + 0x18))(puStack_70,data_len);
        sftp_local._4_4_ =
             _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,
                            "Invalid READLINK/REALPATH response, no name entries");
      }
      else if (link_len < 0xd) {
        if (link_len != 0) {
          (**(code **)(data_len + 0x18))(puStack_70,data_len);
        }
        sftp_local._4_4_ =
             _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"SFTP stat packet too short");
      }
      else {
        uVar2 = _libssh2_ntohu32(puStack_70 + 9);
        packet_len = (ssize_t)uVar2;
        if ((ulong)packet_len < (ulong)channel._4_4_) {
          memcpy(_link_type_local,puStack_70 + 0xd,packet_len);
          _link_type_local[packet_len] = '\0';
          rc._4_4_ = (int)packet_len;
        }
        else {
          rc._4_4_ = -0x26;
        }
        (**(code **)(data_len + 0x18))(puStack_70,data_len);
        sftp_local._4_4_ = rc._4_4_;
      }
    }
  }
  else {
    path_local[0x15c] = '\0';
    path_local[0x15d] = '\0';
    path_local[0x15e] = '\0';
    path_local[0x15f] = '\0';
    sftp_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)data_len,iVar1,"Error waiting for status message");
  }
  return sftp_local._4_4_;
}

Assistant:

static int sftp_symlink(LIBSSH2_SFTP *sftp, const char *path,
                        unsigned int path_len, char *target,
                        unsigned int target_len, int link_type)
{
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    size_t data_len = 0, link_len;
    /* 13 = packet_len(4) + packet_type(1) + request_id(4) + path_len(4) */
    ssize_t packet_len =
        path_len + 13 +
        ((link_type == LIBSSH2_SFTP_SYMLINK) ? (4 + target_len) : 0);
    unsigned char *s, *data = NULL;
    static const unsigned char link_responses[2] =
        { SSH_FXP_NAME, SSH_FXP_STATUS };
    int retcode;

    if(sftp->symlink_state == libssh2_NB_state_idle) {
        sftp->last_errno = LIBSSH2_FX_OK;

        if((sftp->version < 3) && (link_type != LIBSSH2_SFTP_REALPATH)) {
            return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                  "Server does not support SYMLINK or"
                                  " READLINK");
        }

        s = sftp->symlink_packet = LIBSSH2_ALLOC(session, packet_len);
        if(!sftp->symlink_packet) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for "
                                  "SYMLINK/READLINK/REALPATH packet");
        }

        _libssh2_debug((session, LIBSSH2_TRACE_SFTP, "%s %s on %s",
                       (link_type ==
                        LIBSSH2_SFTP_SYMLINK) ? "Creating" : "Reading",
                       (link_type ==
                        LIBSSH2_SFTP_REALPATH) ? "realpath" : "symlink",
                       path));

        _libssh2_store_u32(&s, (uint32_t)(packet_len - 4));

        switch(link_type) {
        case LIBSSH2_SFTP_REALPATH:
            *(s++) = SSH_FXP_REALPATH;
            break;

        case LIBSSH2_SFTP_SYMLINK:
            *(s++) = SSH_FXP_SYMLINK;
            break;

        case LIBSSH2_SFTP_READLINK:
        default:
            *(s++) = SSH_FXP_READLINK;
        }
        sftp->symlink_request_id = sftp->request_id++;
        _libssh2_store_u32(&s, sftp->symlink_request_id);
        _libssh2_store_str(&s, path, path_len);

        if(link_type == LIBSSH2_SFTP_SYMLINK)
            _libssh2_store_str(&s, target, target_len);

        sftp->symlink_state = libssh2_NB_state_created;
    }

    if(sftp->symlink_state == libssh2_NB_state_created) {
        ssize_t rc = _libssh2_channel_write(channel, 0, sftp->symlink_packet,
                                            packet_len);
        if(rc == LIBSSH2_ERROR_EAGAIN)
            return (int)rc;
        else if(packet_len != rc) {
            LIBSSH2_FREE(session, sftp->symlink_packet);
            sftp->symlink_packet = NULL;
            sftp->symlink_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "Unable to send SYMLINK/READLINK command");
        }
        LIBSSH2_FREE(session, sftp->symlink_packet);
        sftp->symlink_packet = NULL;

        sftp->symlink_state = libssh2_NB_state_sent;
    }

    retcode = sftp_packet_requirev(sftp, 2, link_responses,
                                   sftp->symlink_request_id, &data,
                                   &data_len, 9);
    if(retcode == LIBSSH2_ERROR_EAGAIN)
        return retcode;
    else if(retcode == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
        if(data_len > 0) {
            LIBSSH2_FREE(session, data);
        }
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "SFTP symlink packet too short");
    }
    else if(retcode) {
        sftp->symlink_state = libssh2_NB_state_idle;
        return _libssh2_error(session, retcode,
                              "Error waiting for status message");
    }

    sftp->symlink_state = libssh2_NB_state_idle;

    if(data[0] == SSH_FXP_STATUS) {
        retcode = _libssh2_ntohu32(data + 5);
        LIBSSH2_FREE(session, data);
        if(retcode == LIBSSH2_FX_OK)
            return LIBSSH2_ERROR_NONE;
        else {
            sftp->last_errno = retcode;
            return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                  "SFTP Protocol Error");
        }
    }

    if(_libssh2_ntohu32(data + 5) < 1) {
        LIBSSH2_FREE(session, data);
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "Invalid READLINK/REALPATH response, "
                              "no name entries");
    }

    if(data_len < 13) {
        if(data_len > 0) {
            LIBSSH2_FREE(session, data);
        }
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "SFTP stat packet too short");
    }

    /* this reads a u32 and stores it into a signed 32bit value */
    link_len = _libssh2_ntohu32(data + 9);
    if(link_len < target_len) {
        memcpy(target, data + 13, link_len);
        target[link_len] = 0;
        retcode = (int)link_len;
    }
    else
        retcode = LIBSSH2_ERROR_BUFFER_TOO_SMALL;
    LIBSSH2_FREE(session, data);

    return retcode;
}